

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

void __thiscall
MipsOpcodeFormatter::handleOpcodeParameters
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  byte bVar1;
  byte *pbVar2;
  byte *args;
  char *encoding;
  MipsImmediateType type;
  byte *local_c8;
  MipsOpcodeData *local_c0;
  MipsImmediateData *local_b8;
  Identifier *local_b0;
  Identifier *local_a8;
  Identifier *local_a0;
  Identifier *local_98;
  Identifier *local_90;
  Identifier *local_88;
  Identifier *local_80;
  Identifier *local_78;
  Identifier *local_70;
  Identifier *local_68;
  Identifier *local_60;
  MipsImmediateType local_54;
  string local_50;
  
  local_a0 = &(regData->ps2vrt).name;
  local_a8 = &(regData->ps2vrs).name;
  local_b0 = &(regData->ps2vrd).name;
  local_88 = &(regData->vrt).name;
  local_90 = &(regData->vrs).name;
  local_98 = &(regData->vrd).name;
  local_70 = &(regData->frt).name;
  local_80 = &(regData->frd).name;
  local_78 = &(regData->frs).name;
  local_60 = &(regData->grt).name;
  local_68 = &(regData->grd).name;
  args = (byte *)(opData->opcode).encoding;
  local_c0 = opData;
  local_b8 = immData;
switchD_0015ba9f_caseD_57:
  pbVar2 = args;
  bVar1 = *pbVar2;
  if (bVar1 == 0) {
    return;
  }
  args = pbVar2 + 1;
  local_c8 = args;
  switch(bVar1) {
  case 100:
    std::__cxx11::string::append((string *)this);
    goto switchD_0015ba9f_caseD_57;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
    goto switchD_0015ba5b_caseD_65;
  case 0x69:
    decodeImmediateSize((char **)&local_c8,&local_54);
    handleImmediate(this,(local_b8->primary).type,(local_b8->primary).originalValue,
                    (local_c0->opcode).flags);
    args = local_c8;
    goto switchD_0015ba9f_caseD_57;
  case 0x6a:
    handleImmediate(this,(local_b8->secondary).type,(local_b8->secondary).originalValue,
                    (local_c0->opcode).flags);
    break;
  case 0x6d:
  case 0x76:
    args = pbVar2 + 2;
    bVar1 = pbVar2[1];
    local_c8 = args;
    if (bVar1 == 0x74) {
      std::__cxx11::string::append((string *)this);
    }
    else if (bVar1 == 0x73) {
      std::__cxx11::string::append((string *)this);
    }
    else if (bVar1 == 100) {
      std::__cxx11::string::append((string *)this);
    }
    goto switchD_0015ba9f_caseD_57;
  case 0x72:
    tinyformat::format<char>(&local_50,"r%d",(char *)args);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case 0x73:
    std::__cxx11::string::append((string *)this);
    goto switchD_0015ba9f_caseD_57;
  case 0x74:
    std::__cxx11::string::append((string *)this);
    goto switchD_0015ba9f_caseD_57;
  case 0x77:
    std::__cxx11::string::append((char *)this);
    goto switchD_0015ba9f_caseD_57;
  default:
    goto code_r0x0015ba97;
  }
  args = pbVar2 + 2;
  goto switchD_0015ba9f_caseD_57;
code_r0x0015ba97:
  switch(bVar1) {
  case 0x53:
    std::__cxx11::string::append((string *)this);
    goto switchD_0015ba9f_caseD_57;
  case 0x54:
    std::__cxx11::string::append((string *)this);
    goto switchD_0015ba9f_caseD_57;
  case 0x56:
    args = pbVar2 + 2;
    bVar1 = pbVar2[1];
    local_c8 = args;
    if (bVar1 == 0x74) {
      std::__cxx11::string::append((string *)this);
    }
    else if (bVar1 == 0x73) {
      std::__cxx11::string::append((string *)this);
    }
    else if (bVar1 == 100) {
      std::__cxx11::string::append((string *)this);
    }
  case 0x57:
    goto switchD_0015ba9f_caseD_57;
  default:
    if (bVar1 == 0x43) goto switchD_0015ba9f_caseD_57;
    if (bVar1 == 0x44) {
      std::__cxx11::string::append((string *)this);
      goto switchD_0015ba9f_caseD_57;
    }
  case 0x55:
switchD_0015ba5b_caseD_65:
    std::__cxx11::string::push_back((char)this);
    goto switchD_0015ba9f_caseD_57;
  }
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeParameters(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	const char* encoding = opData.opcode.encoding;

	MipsImmediateType type;
	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'r':	// forced register
			buffer += tfm::format("r%d",*encoding);
			encoding += 1;
			break;
		case 's':	// register
			buffer += regData.grs.name.string();
			break;
		case 'd':	// register
			buffer += regData.grd.name.string();
			break;
		case 't':	// register
			buffer += regData.grt.name.string();
			break;
		case 'S':	// fpu register
			buffer += regData.frs.name.string();
			break;
		case 'D':	// fpu register
			buffer += regData.frd.name.string();
			break;
		case 'T':	// fpu register
			buffer += regData.frt.name.string();
			break;
		case 'v':	// psp vfpu reg
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.vrd.name.string();
				break;
			case 's':
				buffer += regData.vrs.name.string();
				break;
			case 't':
				buffer += regData.vrt.name.string();
				break;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.ps2vrd.name.string();
				break;
			case 's':
				buffer += regData.ps2vrs.name.string();
				break;
			case 't':
				buffer += regData.ps2vrt.name.string();
				break;
			}
			break;
		case 'i':	// primary immediate
			decodeImmediateSize(encoding,type);
			handleImmediate(immData.primary.type,immData.primary.originalValue,opData.opcode.flags);
			break;
		case 'j':	// secondary immediate
			handleImmediate(immData.secondary.type,immData.secondary.originalValue, opData.opcode.flags);
			encoding++;
			break;
		case 'C':	// vfpu condition
		case 'W':	// vfpu argument
			// TODO
			break;
		case 'w':	// 'wb' characters
			buffer += "wb";
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}